

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

number_validator<signed_char> __thiscall goodform::sub_form::int8(sub_form *this)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 *in_RSI;
  number_validator<signed_char> nVar2;
  allocator<char> local_61;
  string local_60;
  error_message local_40;
  char local_19 [8];
  int8_t val;
  sub_form *this_local;
  
  this_local = this;
  bVar1 = convert<signed_char>((any *)in_RSI[1],local_19);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"NOT A int8_t",&local_61)
    ;
    error_message::error_message(&local_40,&local_60);
    error_message::operator=((error_message *)*in_RSI,&local_40);
    error_message::~error_message(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  number_validator<signed_char>::number_validator
            ((number_validator<signed_char> *)this,local_19[0],(error_message *)*in_RSI);
  nVar2._8_8_ = extraout_RDX;
  nVar2.error_ = (error_message *)this;
  return nVar2;
}

Assistant:

number_validator<std::int8_t> sub_form::int8()
  {
    std::int8_t val;
    if (!convert(this->variant_, val))
      this->error_ = error_message("NOT A int8_t");
    return number_validator<std::int8_t>(val, this->error_);
  }